

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O0

void __thiscall SessionManager::~SessionManager(SessionManager *this)

{
  bool bVar1;
  reference ppSVar2;
  MutexFactory *this_00;
  vector<Session_*,_std::allocator<Session_*>_> *in_RDI;
  vector<Session_*,_std::allocator<Session_*>_> *unaff_retaddr;
  iterator i;
  vector<Session_*,_std::allocator<Session_*>_> toDelete;
  Mutex *in_stack_ffffffffffffffa8;
  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
  *in_stack_ffffffffffffffb0;
  Session *in_stack_ffffffffffffffb8;
  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_> local_28 [4];
  
  (in_RDI->super__Vector_base<Session_*,_std::allocator<Session_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__SessionManager_00223cc8;
  std::vector<Session_*,_std::allocator<Session_*>_>::vector(unaff_retaddr,in_RDI);
  std::vector<Session_*,_std::allocator<Session_*>_>::clear
            ((vector<Session_*,_std::allocator<Session_*>_> *)0x1e7cdb);
  local_28[0]._M_current =
       (Session **)
       std::vector<Session_*,_std::allocator<Session_*>_>::begin
                 ((vector<Session_*,_std::allocator<Session_*>_> *)in_stack_ffffffffffffffa8);
  while( true ) {
    std::vector<Session_*,_std::allocator<Session_*>_>::end
              ((vector<Session_*,_std::allocator<Session_*>_> *)in_stack_ffffffffffffffa8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>::
              operator*(local_28);
    if (*ppSVar2 != (Session *)0x0) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>::
                operator*(local_28);
      in_stack_ffffffffffffffb8 = *ppSVar2;
      if (in_stack_ffffffffffffffb8 != (Session *)0x0) {
        (*in_stack_ffffffffffffffb8->_vptr_Session[1])();
      }
    }
    __gnu_cxx::__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>::
    operator++((__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_> *
               )in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,in_stack_ffffffffffffffa8);
  std::vector<Session_*,_std::allocator<Session_*>_>::~vector(in_RDI);
  std::vector<Session_*,_std::allocator<Session_*>_>::~vector(in_RDI);
  return;
}

Assistant:

SessionManager::~SessionManager()
{
	std::vector<Session*> toDelete = sessions;
	sessions.clear();

	for (std::vector<Session*>::iterator i = toDelete.begin(); i != toDelete.end(); i++)
	{
		if (*i != NULL) delete *i;
	}

	MutexFactory::i()->recycleMutex(sessionsMutex);
}